

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

CVmNetFile *
CVmObjFile::get_filename_arg
          (vm_val_t *arg,vm_rcdesc *rc,int access,int is_resource_file,os_filetype_t file_type,
          char *mime_type)

{
  int iVar1;
  char *pcVar2;
  CVmNetFile *nf;
  undefined4 extraout_var;
  undefined8 uVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint mode;
  char fname [4096];
  
  if (access - 0x1001U < 6) {
    mode = 0;
  }
  else {
    mode = access;
    switch(access) {
    case 1:
      break;
    case 2:
      mode = 0xe;
      break;
    case 3:
      mode = 7;
      break;
    case 4:
      mode = 0xf;
      break;
    default:
      if (access != 0x1000) {
        err_throw(0x902);
      }
      mode = 0x10;
    }
  }
  if (is_resource_file == 0) {
    iVar1 = CVmNetFile::open((char *)arg,(int)rc,(ulong)mode,file_type,mime_type);
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar1);
    pcVar2 = (char *)_ZTW11G_err_frame();
    fname._8_8_ = *(undefined8 *)pcVar2;
    uVar3 = _ZTW11G_err_frame();
    *(char **)uVar3 = fname;
    fname._0_4_ = _setjmp((__jmp_buf_tag *)(fname + 0x18));
    if (fname._0_4_ == 0) {
      check_safety_for_open(nf,access);
    }
    if (fname._0_4_ == 1) {
      fname[0] = '\x02';
      fname[1] = '\0';
      fname[2] = '\0';
      fname[3] = '\0';
      CVmNetFile::abandon(nf);
      err_rethrow();
    }
    uVar3 = fname._8_8_;
    pcVar2 = (char *)_ZTW11G_err_frame();
    *(undefined8 *)pcVar2 = uVar3;
    if ((fname._0_4_ & 0x4001) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar5 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar5 + 0x10));
      }
      uVar3 = fname._16_8_;
      plVar5 = (long *)_ZTW11G_err_frame();
      *(undefined8 *)(*plVar5 + 0x10) = uVar3;
      err_rethrow();
    }
    if ((fname._0_4_ & 2) != 0) {
      free((void *)fname._16_8_);
    }
  }
  else {
    pcVar2 = CVmBif::get_str_val(arg);
    CVmBif::get_str_val_fname(fname,0x1000,pcVar2);
    nf = CVmNetFile::open_local(fname,0,mode,file_type);
  }
  return nf;
}

Assistant:

CVmNetFile *CVmObjFile::get_filename_arg(
    VMG_ const vm_val_t *arg, const vm_rcdesc *rc,
    int access, int is_resource_file,
    os_filetype_t file_type, const char *mime_type)
{
    /* figure the network file access mode */
    int nmode;
    switch (access)
    {
    case VMOBJFILE_ACCESS_READ:
        /* read access; file must exist */
        nmode = NETF_READ;
        break;

    case VMOBJFILE_ACCESS_WRITE:
        /* write access; create or replace existing file */ 
        nmode = NETF_WRITE | NETF_CREATE | NETF_TRUNC;
        break;

    case VMOBJFILE_ACCESS_RW_KEEP:
        /* read/write access; keep an existing file or create a new one */
        nmode = NETF_READ | NETF_WRITE | NETF_CREATE;
        break;

    case VMOBJFILE_ACCESS_RW_TRUNC:
        /* read/write access; truncate an existing file or create a new one */
        nmode = NETF_READ | NETF_WRITE | NETF_CREATE | NETF_TRUNC;
        break;

    case VMOBJFILE_ACCESS_DELETE:
        /* delete mode */
        nmode = NETF_DELETE;
        break;

    case VMOBJFILE_ACCESS_GETINFO:
    case VMOBJFILE_ACCESS_MKDIR:
    case VMOBJFILE_ACCESS_RMDIR:
    case VMOBJFILE_ACCESS_READDIR:
    case VMOBJFILE_ACCESS_RENAME_TO:
    case VMOBJFILE_ACCESS_RENAME_FROM:
        /* 
         *   getFileType/getFileInfo/rename/directory manipulation - we don't
         *   need to open the file at all for these operations
         */
        nmode = 0;
        break;

    default:
        /* invalid mode */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* we don't have a network file descriptor yet */
    CVmNetFile *netfile = 0;
    char fname[OSFNMAX];

    /* check to see what kind of file spec we have */
    if (is_resource_file)
    {
        /* a resource file must be given as a string name - retrieve it */
        CVmBif::get_str_val_fname(vmg_ fname, sizeof(fname),
                                  CVmBif::get_str_val(vmg_ arg));

        /* resources are always local, so create a local file descriptor */
        netfile = CVmNetFile::open_local(vmg_ fname, 0, nmode, file_type);
    }
    else
    {
        /* regular file - create the network file descriptor */
        netfile = CVmNetFile::open(
            vmg_ arg, rc, nmode, file_type, mime_type);
    }
    
    /* 
     *   If this isn't a resource file, check the file safety mode to see if
     *   the operation is allowed.  Reading resources is always allowed,
     *   regardless of the safety mode, since resources are read-only and are
     *   inherently constrained in the paths they can access.  
     */
    if (!is_resource_file)
    {
        err_try
        {
            check_safety_for_open(vmg_ netfile, access);
        }
        err_catch_disc
        {
            /* abandon the net file descriptor and bubble up the error */
            netfile->abandon(vmg0_);
            err_rethrow();
        }